

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void TestReadString<mp::internal::EndiannessConverter>
               (offset_in_BinaryReader<mp::internal::EndiannessConverter>_to_subr read,
               bool change_endianness)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 uVar2;
  bool bVar3;
  undefined1 *puVar4;
  code *pcVar5;
  long lVar6;
  int in_EDX;
  undefined7 in_register_00000031;
  char *pcVar7;
  long *plVar8;
  undefined1 auVar9 [16];
  string message;
  AssertionResult gtest_ar_1;
  int data [3];
  AssertionResult gtest_ar;
  TestBinaryReader<mp::internal::EndiannessConverter> reader;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  AssertionResult local_140;
  undefined1 local_130 [3];
  undefined1 uStack_12d;
  undefined4 uStack_12c;
  undefined4 local_128;
  AssertionResult local_120;
  long local_110 [2];
  AssertHelper local_100 [3];
  TestBinaryReader<mp::internal::EndiannessConverter> local_e8;
  unsigned_long local_68;
  NLStringRef local_60;
  NLStringRef local_50;
  NLStringRef local_40;
  
  local_128 = 0;
  _local_130 = 3;
  if (in_EDX != 0) {
    puVar4 = local_130 + 3;
    lVar6 = 0;
    do {
      uVar2 = local_130[lVar6];
      local_130[lVar6] = *puVar4;
      *puVar4 = uVar2;
      lVar6 = lVar6 + 1;
      puVar4 = puVar4 + -1;
    } while (lVar6 != 2);
  }
  _local_130 = CONCAT44(0x636261,_local_130);
  mp::NLStringRef::NLStringRef(&local_40,local_130,7);
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            (&local_e8,local_40,(CStringRef)0x27a539);
  plVar8 = (long *)((long)&local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.
                           super_BinaryReaderBase.super_ReaderBase.ptr_ +
                   CONCAT71(in_register_00000031,change_endianness));
  pcVar5 = (code *)read;
  if ((read & 1) != 0) {
    pcVar5 = *(code **)(*plVar8 + -1 + read);
  }
  auVar9 = (*pcVar5)(plVar8);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,auVar9._0_8_,auVar9._8_8_ + auVar9._0_8_);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&local_120,"\"abc\"","name.to_string()",(char (*) [4])0x25e2c5,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((internal)local_120.success_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_160);
    if (local_120.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_120.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x1a4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_120.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.super_BinaryReaderBase.
         super_ReaderBase.name_._M_dataplus._M_p !=
      &local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.super_BinaryReaderBase.
       super_ReaderBase.name_.field_2) {
    operator_delete(local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.
                    super_BinaryReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.
                    super_BinaryReaderBase.super_ReaderBase.name_.field_2._M_allocated_capacity + 1)
    ;
  }
  paVar1 = &local_e8.super_TestReaderBase.super_ReaderBase.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_TestReaderBase.super_ReaderBase.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.super_TestReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_e8.super_TestReaderBase.super_ReaderBase.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  _local_130 = (uint7)_local_130;
  local_68 = 6;
  mp::NLStringRef::NLStringRef(&local_50,local_130,6);
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            (&local_e8,local_50,(CStringRef)0x27a539);
  fmt::format<unsigned_long>(&local_160,(CStringRef)0x25e3c2,&local_68);
  testing::AssertionSuccess();
  if (local_140.success_ == true) {
    local_120._0_8_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pcVar5 = (code *)read;
      if ((read & 1) != 0) {
        pcVar5 = *(code **)(*plVar8 + -1 + read);
      }
      (*pcVar5)(plVar8);
    }
    testing::AssertionResult::operator<<
              (&local_140,
               (char (*) [105])
               "Expected: (reader.*read)() throws an exception of type mp::BinaryReadError.\n  Actual: it throws nothing."
              );
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110) {
      operator_delete((void *)local_120._0_8_,local_110[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_120);
  if (local_140.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar7 = "";
  }
  else {
    pcVar7 = ((local_140.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_100,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x1ad,pcVar7);
  testing::internal::AssertHelper::operator=(local_100,(Message *)&local_120);
  testing::internal::AssertHelper::~AssertHelper(local_100);
  if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
     ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_120._0_8_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_140.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.super_BinaryReaderBase.
         super_ReaderBase.name_._M_dataplus._M_p !=
      &local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.super_BinaryReaderBase.
       super_ReaderBase.name_.field_2) {
    operator_delete(local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.
                    super_BinaryReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.
                    super_BinaryReaderBase.super_ReaderBase.name_.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_TestReaderBase.super_ReaderBase.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.super_TestReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_e8.super_TestReaderBase.super_ReaderBase.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  _local_130 = CONCAT44(uStack_12c,0xffffffff);
  if ((char)in_EDX != '\0') {
    puVar4 = local_130 + 3;
    lVar6 = 0;
    do {
      uVar2 = local_130[lVar6];
      local_130[lVar6] = *puVar4;
      *puVar4 = uVar2;
      lVar6 = lVar6 + 1;
      puVar4 = puVar4 + -1;
    } while (lVar6 != 2);
  }
  mp::NLStringRef::NLStringRef(&local_60,local_130,7);
  TestBinaryReader<mp::internal::EndiannessConverter>::TestBinaryReader
            (&local_e8,local_60,(CStringRef)0x27a539);
  testing::AssertionSuccess();
  if ((internal)local_120.success_ == (internal)0x1) {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"test:offset 0: expected unsigned integer","");
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      if ((read & 1) != 0) {
        read = *(undefined8 *)(*plVar8 + -1 + read);
      }
      (*(code *)read)(plVar8);
    }
    testing::AssertionResult::operator<<
              (&local_120,
               (char (*) [105])
               "Expected: (reader.*read)() throws an exception of type mp::BinaryReadError.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_160);
  if (local_120.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar7 = "";
  }
  else {
    pcVar7 = ((local_120.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_140,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x1b6,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_160);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_160._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_120.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.super_BinaryReaderBase.
         super_ReaderBase.name_._M_dataplus._M_p !=
      &local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.super_BinaryReaderBase.
       super_ReaderBase.name_.field_2) {
    operator_delete(local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.
                    super_BinaryReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_e8.super_BinaryReader<mp::internal::EndiannessConverter>.
                    super_BinaryReaderBase.super_ReaderBase.name_.field_2._M_allocated_capacity + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.super_TestReaderBase.super_ReaderBase.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8.super_TestReaderBase.super_ReaderBase.name_._M_dataplus._M_p,
                    local_e8.super_TestReaderBase.super_ReaderBase.name_.field_2.
                    _M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TestReadString(fmt::StringRef (BinaryReader<Converter>::*read)(),
                    bool change_endianness = false) {
  int data[] = {3, 0, 0};
  if (change_endianness)
    ChangeEndianness(data[0]);
  char *str = reinterpret_cast<char*>(data + 1);
  std::strcpy(str, "abc");
  {
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), sizeof(int) + 3));
    fmt::StringRef name = (reader.*read)();
    EXPECT_EQ("abc", name.to_string());
  }
  {
    str[2] = 0;
    std::size_t size = sizeof(int) + 2;
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), size));
    std::string message =
        fmt::format("test:offset {}: unexpected end of file", size);
    EXPECT_THROW_MSG((reader.*read)(), mp::BinaryReadError, message);
  }
  data[0] = -1;
  if (change_endianness)
    ChangeEndianness(data[0]);
  {
    TestBinaryReader<Converter> reader(
          mp::NLStringRef(reinterpret_cast<char*>(data), sizeof(int) + 3));
    EXPECT_THROW_MSG((reader.*read)(), mp::BinaryReadError,
                     "test:offset 0: expected unsigned integer");
  }
}